

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

int read_CodersInfo(archive_read *a,_7z_coders_info *ci)

{
  int iVar1;
  _7z_folder *p_Var2;
  uint64_t *puVar3;
  uint local_4c;
  uint j;
  _7z_folder *folder;
  undefined1 auStack_38 [4];
  uint i;
  _7z_digests digest;
  uchar *p;
  _7z_coders_info *ci_local;
  archive_read *a_local;
  
  memset(ci,0,0x18);
  memset(auStack_38,0,0x10);
  digest.digests = (uint32_t *)header_bytes(a,1);
  if (((digest.digests != (uint32_t *)0x0) && ((uchar)*digest.digests == '\v')) &&
     (iVar1 = parse_7zip_uint64(a,&ci->numFolders), -1 < iVar1)) {
    if (100000000 < ci->numFolders) {
      return -1;
    }
    digest.digests = (uint32_t *)header_bytes(a,1);
    if (digest.digests != (uint32_t *)0x0) {
      if ((uchar)*digest.digests == '\0') {
        p_Var2 = (_7z_folder *)calloc(ci->numFolders,0x68);
        ci->folders = p_Var2;
        if (ci->folders == (_7z_folder *)0x0) {
          return -1;
        }
        for (folder._4_4_ = 0; (ulong)folder._4_4_ < ci->numFolders; folder._4_4_ = folder._4_4_ + 1
            ) {
          iVar1 = read_Folder(a,ci->folders + folder._4_4_);
          if (iVar1 < 0) goto LAB_006cd073;
        }
      }
      else {
        if ((uchar)*digest.digests != '\x01') {
          archive_set_error(&a->archive,-1,"Malformed 7-Zip archive");
          goto LAB_006cd073;
        }
        iVar1 = parse_7zip_uint64(a,&ci->dataStreamIndex);
        if (iVar1 < 0) {
          return -1;
        }
        if (100000000 < ci->dataStreamIndex) {
          return -1;
        }
        if (ci->numFolders != 0) {
          archive_set_error(&a->archive,-1,"Malformed 7-Zip archive");
          goto LAB_006cd073;
        }
      }
      digest.digests = (uint32_t *)header_bytes(a,1);
      if ((digest.digests != (uint32_t *)0x0) && ((uchar)*digest.digests == '\f')) {
        for (folder._4_4_ = 0; (ulong)folder._4_4_ < ci->numFolders; folder._4_4_ = folder._4_4_ + 1
            ) {
          p_Var2 = ci->folders;
          puVar3 = (uint64_t *)calloc(p_Var2[folder._4_4_].numOutStreams,8);
          p_Var2[folder._4_4_].unPackSize = puVar3;
          if (p_Var2[folder._4_4_].unPackSize == (uint64_t *)0x0) goto LAB_006cd073;
          for (local_4c = 0; (ulong)local_4c < p_Var2[folder._4_4_].numOutStreams;
              local_4c = local_4c + 1) {
            iVar1 = parse_7zip_uint64(a,p_Var2[folder._4_4_].unPackSize + local_4c);
            if (iVar1 < 0) goto LAB_006cd073;
          }
        }
        digest.digests = (uint32_t *)header_bytes(a,1);
        if (digest.digests != (uint32_t *)0x0) {
          if ((uchar)*digest.digests == '\0') {
            return 0;
          }
          if (((uchar)*digest.digests == '\n') &&
             (iVar1 = read_Digests(a,(_7z_digests *)auStack_38,ci->numFolders), -1 < iVar1)) {
            for (folder._4_4_ = 0; (ulong)folder._4_4_ < ci->numFolders;
                folder._4_4_ = folder._4_4_ + 1) {
              ci->folders[folder._4_4_].digest_defined = _auStack_38[folder._4_4_];
              ci->folders[folder._4_4_].digest =
                   *(uint32_t *)(digest.defineds + (ulong)folder._4_4_ * 4);
            }
            digest.digests = (uint32_t *)header_bytes(a,1);
            if ((digest.digests != (uint32_t *)0x0) && ((uchar)*digest.digests == '\0')) {
              free_Digest((_7z_digests *)auStack_38);
              return 0;
            }
          }
        }
      }
    }
  }
LAB_006cd073:
  free_Digest((_7z_digests *)auStack_38);
  return -1;
}

Assistant:

static int
read_CodersInfo(struct archive_read *a, struct _7z_coders_info *ci)
{
	const unsigned char *p;
	struct _7z_digests digest;
	unsigned i;

	memset(ci, 0, sizeof(*ci));
	memset(&digest, 0, sizeof(digest));

	if ((p = header_bytes(a, 1)) == NULL)
		goto failed;
	if (*p != kFolder)
		goto failed;

	/*
	 * Read NumFolders.
	 */
	if (parse_7zip_uint64(a, &(ci->numFolders)) < 0)
		goto failed;
	if (UMAX_ENTRY < ci->numFolders)
		return (-1);

	/*
	 * Read External.
	 */
	if ((p = header_bytes(a, 1)) == NULL)
		goto failed;
	switch (*p) {
	case 0:
		ci->folders =
			calloc((size_t)ci->numFolders, sizeof(*ci->folders));
		if (ci->folders == NULL)
			return (-1);
		for (i = 0; i < ci->numFolders; i++) {
			if (read_Folder(a, &(ci->folders[i])) < 0)
				goto failed;
		}
		break;
	case 1:
		if (parse_7zip_uint64(a, &(ci->dataStreamIndex)) < 0)
			return (-1);
		if (UMAX_ENTRY < ci->dataStreamIndex)
			return (-1);
		if (ci->numFolders > 0) {
			archive_set_error(&a->archive, -1,
			    "Malformed 7-Zip archive");
			goto failed;
		}
		break;
	default:
		archive_set_error(&a->archive, -1,
		    "Malformed 7-Zip archive");
		goto failed;
	}

	if ((p = header_bytes(a, 1)) == NULL)
		goto failed;
	if (*p != kCodersUnPackSize)
		goto failed;

	for (i = 0; i < ci->numFolders; i++) {
		struct _7z_folder *folder = &(ci->folders[i]);
		unsigned j;

		folder->unPackSize =
		    calloc((size_t)folder->numOutStreams, sizeof(*folder->unPackSize));
		if (folder->unPackSize == NULL)
			goto failed;
		for (j = 0; j < folder->numOutStreams; j++) {
			if (parse_7zip_uint64(a, &(folder->unPackSize[j])) < 0)
				goto failed;
		}
	}

	/*
	 * Read CRCs.
	 */
	if ((p = header_bytes(a, 1)) == NULL)
		goto failed;
	if (*p == kEnd)
		return (0);
	if (*p != kCRC)
		goto failed;
	if (read_Digests(a, &digest, (size_t)ci->numFolders) < 0)
		goto failed;
	for (i = 0; i < ci->numFolders; i++) {
		ci->folders[i].digest_defined = digest.defineds[i];
		ci->folders[i].digest = digest.digests[i];
	}

	/*
	 *  Must be kEnd.
	 */
	if ((p = header_bytes(a, 1)) == NULL)
		goto failed;
	if (*p != kEnd)
		goto failed;
	free_Digest(&digest);
	return (0);
failed:
	free_Digest(&digest);
	return (-1);
}